

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

void __thiscall CS248::Application::load(Application *this,SceneInfo *sceneInfo)

{
  Type TVar1;
  LightInfo *light;
  double dVar2;
  double theta;
  double dVar3;
  PathTracer *pPVar4;
  _Base_ptr p_Var5;
  SceneLight *pSVar6;
  Scene *this_00;
  Matrix4x4 *transform;
  long lVar7;
  Matrix4x4 *transform_00;
  uint uVar8;
  ulong uVar9;
  vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
  objects;
  LightInfo default_light;
  double local_1d8;
  double local_1d0;
  double local_1c8;
  double local_1c0;
  undefined1 local_1b8 [8];
  SceneLight **ppSStack_1b0;
  SceneLight **local_1a8;
  Application *local_198;
  _Base_ptr local_190;
  undefined1 local_188 [8];
  _Base_ptr p_Stack_180;
  SceneObject **local_178;
  PathTracer *local_168;
  _Base_ptr p_Stack_160;
  undefined1 local_158 [16];
  double local_148;
  Scene *local_140;
  PathTracer *local_138;
  _Base_ptr p_Stack_130;
  double local_128;
  vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
  local_118;
  vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
  local_100;
  undefined1 local_e8 [84];
  float local_94;
  
  local_1b8 = (undefined1  [8])0x0;
  ppSStack_1b0 = (SceneLight **)0x0;
  local_1a8 = (SceneLight **)0x0;
  local_178 = (SceneObject **)0x0;
  local_168 = (PathTracer *)0x0;
  p_Stack_160 = (_Base_ptr)0x0;
  local_188 = (undefined1  [8])0x0;
  p_Stack_180 = (_Base_ptr)0x0;
  uVar8 = (int)((long)(sceneInfo->nodes).
                      super__Vector_base<CS248::Collada::Node,_std::allocator<CS248::Collada::Node>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(sceneInfo->nodes).
                      super__Vector_base<CS248::Collada::Node,_std::allocator<CS248::Collada::Node>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3d70a3d7;
  local_190 = (_Base_ptr)sceneInfo;
  if ((int)uVar8 < 1) {
    local_1d0 = 0.0;
    local_1d8 = 0.0;
    local_1c8 = 0.0;
  }
  else {
    uVar9 = (ulong)(uVar8 & 0x7fffffff);
    local_1c0 = 0.0;
    lVar7 = 0x48;
    local_1d0 = 0.0;
    local_1d8 = 0.0;
    local_1c8 = 0.0;
    local_198 = this;
    do {
      light = *(LightInfo **)(*(long *)local_190 + -8 + lVar7);
      TVar1 = (light->super_Instance).type;
      if (TVar1 < MATERIAL) {
        transform_00 = (Matrix4x4 *)(*(long *)local_190 + lVar7);
        switch(TVar1) {
        case CAMERA:
          local_158._0_8_ = local_168;
          local_158._8_8_ = p_Stack_160;
          local_148 = local_1c0;
          local_140 = (Scene *)0x3ff0000000000000;
          Matrix4x4::operator*(transform_00,(Vector4D *)local_158);
          Vector4D::to3D((Vector4D *)local_e8);
          local_168 = local_138;
          p_Stack_160 = p_Stack_130;
          local_1c0 = local_128;
          local_158._0_4_ = light->light_type;
          local_158._4_4_ = (light->spectrum).r;
          local_158._8_4_ = (light->spectrum).g;
          local_158._12_4_ = (light->spectrum).b;
          local_148 = (light->position).x;
          local_140 = (Scene *)0x3ff0000000000000;
          Matrix4x4::operator*(transform_00,(Vector4D *)local_158);
          Vector4D::to3D((Vector4D *)local_e8);
          dVar3 = local_128;
          p_Var5 = p_Stack_130;
          pPVar4 = local_138;
          this = local_198;
          init_camera(local_198,(CameraInfo *)light,transform);
          local_1d0 = 1.0 / SQRT(dVar3 * dVar3 +
                                 (double)pPVar4 * (double)pPVar4 + (double)p_Var5 * (double)p_Var5);
          local_1c8 = (double)pPVar4 * local_1d0;
          local_1d8 = (double)p_Var5 * local_1d0;
          local_1d0 = local_1d0 * dVar3;
          break;
        case LIGHT:
          local_e8._0_8_ = init_light(this,light,transform_00);
          if (ppSStack_1b0 == local_1a8) {
            this = (Application *)local_1b8;
            std::
            vector<CS248::DynamicScene::SceneLight*,std::allocator<CS248::DynamicScene::SceneLight*>>
            ::_M_realloc_insert<CS248::DynamicScene::SceneLight*>
                      ((vector<CS248::DynamicScene::SceneLight*,std::allocator<CS248::DynamicScene::SceneLight*>>
                        *)this,(iterator)ppSStack_1b0,(SceneLight **)local_e8);
          }
          else {
            *ppSStack_1b0 = (SceneLight *)local_e8._0_8_;
            ppSStack_1b0 = ppSStack_1b0 + 1;
          }
          break;
        case SPHERE:
          local_e8._0_8_ = init_sphere(this,(SphereInfo *)light,transform_00);
          if (p_Stack_180 == (_Base_ptr)local_178) {
            this = (Application *)local_188;
            std::
            vector<CS248::DynamicScene::SceneObject*,std::allocator<CS248::DynamicScene::SceneObject*>>
            ::_M_realloc_insert<CS248::DynamicScene::SceneObject*>
                      ((vector<CS248::DynamicScene::SceneObject*,std::allocator<CS248::DynamicScene::SceneObject*>>
                        *)this,(iterator)p_Stack_180,(SceneObject **)local_e8);
          }
          else {
LAB_00189946:
            *(undefined8 *)p_Stack_180 = local_e8._0_8_;
            p_Stack_180 = (_Base_ptr)&p_Stack_180->_M_parent;
          }
          break;
        case POLYMESH:
          local_e8._0_8_ = init_polymesh(this,(PolymeshInfo *)light,transform_00);
          if (p_Stack_180 != (_Base_ptr)local_178) goto LAB_00189946;
          this = (Application *)local_188;
          std::
          vector<CS248::DynamicScene::SceneObject*,std::allocator<CS248::DynamicScene::SceneObject*>>
          ::_M_realloc_insert<CS248::DynamicScene::SceneObject*>
                    ((vector<CS248::DynamicScene::SceneObject*,std::allocator<CS248::DynamicScene::SceneObject*>>
                      *)this,(iterator)p_Stack_180,(SceneObject **)local_e8);
        }
      }
      lVar7 = lVar7 + 200;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
    this = local_198;
    if ((undefined1  [8])ppSStack_1b0 != local_1b8) goto LAB_00189a67;
  }
  Collada::LightInfo::LightInfo((LightInfo *)local_e8);
  pSVar6 = (SceneLight *)operator_new(0x18);
  pSVar6->_vptr_SceneLight = (_func_int **)&PTR_get_static_light_0026d2d8;
  pSVar6[1]._vptr_SceneLight = (_func_int **)local_e8._76_8_;
  *(float *)&pSVar6[2]._vptr_SceneLight = local_94;
  local_158._0_8_ = pSVar6;
  if (ppSStack_1b0 == local_1a8) {
    std::vector<CS248::DynamicScene::SceneLight*,std::allocator<CS248::DynamicScene::SceneLight*>>::
    _M_realloc_insert<CS248::DynamicScene::SceneLight*>
              ((vector<CS248::DynamicScene::SceneLight*,std::allocator<CS248::DynamicScene::SceneLight*>>
                *)local_1b8,(iterator)ppSStack_1b0,(SceneLight **)local_158);
  }
  else {
    *ppSStack_1b0 = pSVar6;
    ppSStack_1b0 = ppSStack_1b0 + 1;
  }
  if ((undefined1 *)local_e8._40_8_ != local_e8 + 0x38) {
    operator_delete((void *)local_e8._40_8_);
  }
  if ((undefined1 *)local_e8._8_8_ != local_e8 + 0x18) {
    operator_delete((void *)local_e8._8_8_);
  }
LAB_00189a67:
  this_00 = (Scene *)operator_new(0x128);
  std::
  vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>::
  vector(&local_100,
         (vector<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
          *)local_188);
  std::vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
  ::vector(&local_118,
           (vector<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
            *)local_1b8);
  DynamicScene::Scene::Scene(this_00,&local_100,&local_118);
  this->scene = this_00;
  if (local_118.
      super__Vector_base<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.
                    super__Vector_base<CS248::DynamicScene::SceneLight_*,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_100.
      super__Vector_base<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.
                    super__Vector_base<CS248::DynamicScene::SceneObject_*,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  DynamicScene::Scene::get_bbox((BBox *)local_e8,this->scene);
  if ((((double)local_e8._24_8_ <= (double)local_e8._0_8_) &&
      ((double)local_e8._32_8_ <= (double)local_e8._8_8_)) &&
     ((double)local_e8._40_8_ <= (double)local_e8._16_8_)) {
    local_148 = ((double)local_e8._40_8_ + (double)local_e8._16_8_) * 0.5;
    dVar3 = ((double)local_e8._8_8_ + (double)local_e8._32_8_) * 0.5;
    local_158._8_4_ = SUB84(dVar3,0);
    local_158._0_8_ = ((double)local_e8._0_8_ + (double)local_e8._24_8_) * 0.5;
    local_158._12_4_ = (int)((ulong)dVar3 >> 0x20);
    dVar3 = SQRT((double)local_e8._64_8_ * (double)local_e8._64_8_ +
                 (double)local_e8._48_8_ * (double)local_e8._48_8_ +
                 (double)local_e8._56_8_ * (double)local_e8._56_8_) * 0.5 * 1.5;
    this->canonical_view_distance = dVar3;
    local_168 = (PathTracer *)(dVar3 + dVar3);
    local_190 = (_Base_ptr)(dVar3 * 20.0);
    local_198 = (Application *)acos(local_1d8);
    dVar2 = atan2(local_1c8,local_1d0);
    Camera::place(&this->canonicalCamera,(Vector3D *)local_158,(double)local_198,dVar2,
                  (double)local_168,dVar3 / 10.0,(double)local_190);
    dVar2 = acos(local_1d8);
    theta = atan2(local_1c8,local_1d0);
    Camera::place(&this->camera,(Vector3D *)local_158,dVar2,theta,(double)local_168,dVar3 / 10.0,
                  (double)local_190);
    this->scroll_rate = this->canonical_view_distance / 10.0;
  }
  DynamicScene::Scene::set_draw_styles
            (this->scene,&this->defaultStyle,&this->hoverStyle,&this->selectStyle);
  if (local_188 != (undefined1  [8])0x0) {
    operator_delete((void *)local_188);
  }
  if (local_1b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1b8);
  }
  return;
}

Assistant:

void Application::load(SceneInfo *sceneInfo) {
  vector<Collada::Node> &nodes = sceneInfo->nodes;
  vector<DynamicScene::SceneLight *> lights;
  vector<DynamicScene::SceneObject *> objects;

  // save camera position to update camera control later
  CameraInfo *c;
  Vector3D c_pos = Vector3D();
  Vector3D c_dir = Vector3D();

  int len = nodes.size();
  for (int i = 0; i < len; i++) {
    Collada::Node &node = nodes[i];
    Collada::Instance *instance = node.instance;
    const Matrix4x4 &transform = node.transform;

    switch (instance->type) {
      case Collada::Instance::CAMERA:
        c = static_cast<CameraInfo *>(instance);
        c_pos = (transform * Vector4D(c_pos, 1)).to3D();
        c_dir = (transform * Vector4D(c->view_dir, 1)).to3D().unit();
        init_camera(*c, transform);
        break;
      case Collada::Instance::LIGHT: {
        lights.push_back(
            init_light(static_cast<LightInfo &>(*instance), transform));
        break;
      }
      case Collada::Instance::SPHERE:
        objects.push_back(
            init_sphere(static_cast<SphereInfo &>(*instance), transform));
        break;
      case Collada::Instance::POLYMESH:
        objects.push_back(
            init_polymesh(static_cast<PolymeshInfo &>(*instance), transform));
        break;
      case Collada::Instance::MATERIAL:
        init_material(static_cast<MaterialInfo &>(*instance));
        break;
    }
  }

  if (lights.size() == 0) {  // no lights, default use ambient_light
    LightInfo default_light = LightInfo();
    lights.push_back(new DynamicScene::AmbientLight(default_light));
  }
  scene = new DynamicScene::Scene(objects, lights);

  const BBox &bbox = scene->get_bbox();
  if (!bbox.empty()) {
    Vector3D target = bbox.centroid();
    canonical_view_distance = bbox.extent.norm() / 2 * 1.5;

    double view_distance = canonical_view_distance * 2;
    double min_view_distance = canonical_view_distance / 10.0;
    double max_view_distance = canonical_view_distance * 20.0;

    canonicalCamera.place(target, acos(c_dir.y), atan2(c_dir.x, c_dir.z),
                          view_distance, min_view_distance, max_view_distance);

    camera.place(target, acos(c_dir.y), atan2(c_dir.x, c_dir.z), view_distance,
                 min_view_distance, max_view_distance);

    set_scroll_rate();
  }

  // set default draw styles for meshEdit -
  scene->set_draw_styles(&defaultStyle, &hoverStyle, &selectStyle);

  // cerr << "==================================" << endl;
  // cerr << "CAMERA" << endl;
  // cerr << "      hFov: " << camera.hFov << endl;
  // cerr << "      vFov: " << camera.vFov << endl;
  // cerr << "        ar: " << camera.ar << endl;
  // cerr << "     nClip: " << camera.nClip << endl;
  // cerr << "     fClip: " << camera.fClip << endl;
  // cerr << "       pos: " << camera.pos << endl;
  // cerr << " targetPos: " << camera.targetPos << endl;
  // cerr << "       phi: " << camera.phi << endl;
  // cerr << "     theta: " << camera.theta << endl;
  // cerr << "         r: " << camera.r << endl;
  // cerr << "      minR: " << camera.minR << endl;
  // cerr << "      maxR: " << camera.maxR << endl;
  // cerr << "       c2w: " << camera.c2w << endl;
  // cerr << "   screenW: " << camera.screenW << endl;
  // cerr << "   screenH: " << camera.screenH << endl;
  // cerr << "screenDist: " << camera.screenDist<< endl;
  // cerr << "==================================" << endl;
}